

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

void __thiscall Imf_3_4::Header::erase(Header *this,char *name)

{
  iterator __position;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  if (*name != '\0') {
    Name::Name((Name *)&_iex_throw_s,name);
    __position = std::
                 _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
                 ::find((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
                         *)this,(key_type *)&_iex_throw_s);
    if ((_Rb_tree_header *)__position._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long **)(__position._M_node + 9) != (long *)0x0) {
        (**(code **)(**(long **)(__position._M_node + 9) + 8))();
      }
      std::
      _Rb_tree<Imf_3_4::Name,std::pair<Imf_3_4::Name_const,Imf_3_4::Attribute*>,std::_Select1st<std::pair<Imf_3_4::Name_const,Imf_3_4::Attribute*>>,std::less<Imf_3_4::Name>,std::allocator<std::pair<Imf_3_4::Name_const,Imf_3_4::Attribute*>>>
      ::erase_abi_cxx11_((_Rb_tree<Imf_3_4::Name,std::pair<Imf_3_4::Name_const,Imf_3_4::Attribute*>,std::_Select1st<std::pair<Imf_3_4::Name_const,Imf_3_4::Attribute*>>,std::less<Imf_3_4::Name>,std::allocator<std::pair<Imf_3_4::Name_const,Imf_3_4::Attribute*>>>
                          *)this,__position);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::operator<<(local_188,"Image attribute name cannot be an empty string.");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
Header::erase (const char name[])
{
    if (name[0] == 0)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Image attribute name cannot be an empty string.");

    AttributeMap::iterator i = _map.find (name);
    if (i != _map.end ())
    {
        delete i->second;
        _map.erase (i);
    }
}